

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O2

bool Limonp::unicodeToUtf8(const_iterator begin,const_iterator end,string *res)

{
  char cVar1;
  const_iterator cVar2;
  
  if (begin._M_current < end._M_current) {
    res->_M_string_length = 0;
    *(res->_M_dataplus)._M_p = '\0';
    for (cVar2._M_current = begin._M_current; cVar2._M_current != end._M_current;
        cVar2._M_current = cVar2._M_current + 1) {
      cVar1 = (char)res;
      if (0x7f < *cVar2._M_current) {
        if (0x7ff < *cVar2._M_current) {
          std::__cxx11::string::push_back(cVar1);
        }
        std::__cxx11::string::push_back(cVar1);
      }
      std::__cxx11::string::push_back(cVar1);
    }
  }
  return begin._M_current < end._M_current;
}

Assistant:

inline bool unicodeToUtf8(vector<uint16_t>::const_iterator begin, vector<uint16_t>::const_iterator end, string& res)
    {
        if(begin >= end)
        {
            return false;
        }
        res.clear();
        uint16_t ui;
        while(begin != end)
        {
            ui = *begin;
            if(ui <= 0x7f)
            {
                res += char(ui);
            }
            else if(ui <= 0x7ff)
            {
                res += char(((ui>>6) & 0x1f) | 0xc0);
                res += char((ui & 0x3f) | 0x80);
            }
            else
            {
                res += char(((ui >> 12) & 0x0f )| 0xe0);
                res += char(((ui>>6) & 0x3f )| 0x80 );
                res += char((ui & 0x3f) | 0x80);
            }
            begin ++;
        }
        return true;
    }